

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_table_as_nested_root
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              char *fid,uint16_t align,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  flatbuffers_uoffset_t fVar2;
  flatbuffers_uoffset_t end;
  void *pvVar3;
  flatbuffers_uoffset_t bufsiz;
  flatbuffers_uoffset_t *buf;
  flatcc_table_verifier_f *tvf_local;
  uint16_t align_local;
  char *fid_local;
  int required_local;
  flatbuffers_voffset_t id_local;
  flatcc_table_verifier_descriptor_t *td_local;
  
  iVar1 = flatcc_verify_vector_field(td,id,required,(ulong)align,1,0xffffffff);
  if (iVar1 == 0) {
    pvVar3 = get_field_ptr(td,id);
    if (pvVar3 == (void *)0x0) {
      td_local._4_4_ = 0;
    }
    else {
      fVar2 = read_uoffset(pvVar3,0);
      end = read_uoffset((void *)((long)pvVar3 + (ulong)fVar2),0);
      pvVar3 = (void *)((long)((long)pvVar3 + (ulong)fVar2) + 4);
      iVar1 = flatcc_verify_buffer_header(pvVar3,(ulong)end,fid);
      if (iVar1 == 0) {
        fVar2 = read_uoffset(pvVar3,0);
        td_local._4_4_ = verify_table(pvVar3,end,0,fVar2,td->ttl,tvf);
      }
      else {
        td_local._4_4_ = flatcc_verify_buffer_header(pvVar3,(ulong)end,fid);
      }
    }
  }
  else {
    td_local._4_4_ = flatcc_verify_vector_field(td,id,required,(ulong)align,1,0xffffffff);
  }
  return td_local._4_4_;
}

Assistant:

int flatcc_verify_table_as_nested_root(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, const char *fid,
        uint16_t align, flatcc_table_verifier_f tvf)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    check_result(flatcc_verify_vector_field(td, id, required, align, 1, FLATBUFFERS_COUNT_MAX(1)));
    if (0 == (buf = get_field_ptr(td, id))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    bufsiz = read_uoffset(buf, 0);
    ++buf;
    /*
     * Don't verify nested buffers identifier - information is difficult to get and
     * might not be what is desired anyway. User can do it later.
     */
    check_result(flatcc_verify_buffer_header(buf, bufsiz, fid));
    return verify_table(buf, bufsiz, 0, read_uoffset(buf, 0), td->ttl, tvf);
}